

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Rotate
               (Image *in,uint32_t startXIn,uint32_t startYIn,double centerXIn,double centerYIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,double centerXOut,double centerYOut,
               uint32_t width,uint32_t height,double angle)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uchar uVar11;
  uint uVar12;
  uint uVar13;
  uchar *puVar14;
  uchar *puVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double posY;
  undefined1 auVar24 [16];
  undefined1 in_ZMM7 [64];
  double posX;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM16 [16];
  ImageTemplate<unsigned_char> local_58;
  undefined1 extraout_var [56];
  
  auVar25 = in_ZMM7._0_16_;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  dVar19 = cos(angle);
  auVar20._0_8_ = sin(angle);
  auVar20._8_56_ = extraout_var;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar19;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = centerXOut;
  uVar1 = out->_rowSize;
  uVar2 = in->_rowSize;
  puVar3 = in->_data;
  puVar14 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar20._0_8_ * centerYOut;
  auVar21 = vfmadd231sd_fma(auVar21,auVar32,auVar22);
  puVar15 = puVar14 + uVar1 * height;
  dVar5 = centerXIn - auVar21._0_8_;
  auVar21 = vcvtusi2sd_avx512f(auVar25,startYIn);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar19 * centerYOut;
  auVar23 = vfnmadd231sd_fma(auVar23,auVar20._0_16_,auVar22);
  auVar22 = vcvtusi2sd_avx512f(auVar25,startXIn);
  dVar6 = centerYIn - auVar23._0_8_;
  for (; puVar14 != puVar15; puVar14 = puVar14 + uVar1) {
    dVar10 = dVar6;
    dVar4 = dVar5;
    for (uVar16 = 0; width != uVar16; uVar16 = uVar16 + 1) {
      uVar11 = '\0';
      if ((auVar22._0_8_ <= dVar4) && (auVar21._0_8_ <= dVar10)) {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar4;
        uVar13 = vcvttsd2usi_avx512f(auVar25);
        uVar11 = '\0';
        if ((uVar13 < (startXIn - 1) + width) &&
           (auVar24._8_8_ = 0, auVar24._0_8_ = dVar10, uVar17 = vcvttsd2usi_avx512f(auVar24),
           uVar11 = '\0', uVar17 < (startYIn - 1) + height)) {
          uVar12 = uVar2 * uVar17;
          auVar23 = vcvtusi2sd_avx512f(in_XMM16,uVar13);
          uVar18 = (ulong)uVar13;
          auVar25 = vcvtusi2sd_avx512f(in_XMM16,uVar17);
          dVar7 = dVar4 - auVar23._0_8_;
          dVar8 = dVar10 - auVar25._0_8_;
          dVar9 = 1.0 - dVar8;
          auVar23 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[uVar18 + 1 + (ulong)uVar12]);
          auVar25 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[uVar18 + uVar12]);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = (1.0 - dVar7) * auVar25._0_8_;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar9;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dVar9 * dVar7 * auVar23._0_8_;
          auVar32 = vfmadd231sd_fma(auVar31,auVar30,auVar28);
          auVar23 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[(ulong)uVar2 + uVar18 + uVar12]);
          auVar25 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[(ulong)uVar2 + 1 + uVar18 + uVar12]);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar8;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = (1.0 - dVar7) * auVar23._0_8_;
          auVar23 = vfmadd213sd_fma(auVar29,auVar27,auVar32);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar7 * auVar25._0_8_;
          auVar23 = vfmadd213sd_fma(auVar26,auVar27,auVar23);
          uVar11 = (uchar)(int)(auVar23._0_8_ + 0.5);
        }
      }
      puVar14[uVar16] = uVar11;
      dVar4 = dVar19 + dVar4;
      dVar10 = dVar10 - auVar20._0_8_;
    }
    dVar5 = auVar20._0_8_ + dVar5;
    dVar6 = dVar19 + dVar6;
  }
  return;
}

Assistant:

void Rotate( const Image & in, uint32_t startXIn, uint32_t startYIn, double centerXIn, double centerYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 double centerXOut, double centerYOut, uint32_t width, uint32_t height, double angle )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        const double cosAngle = cos( angle );
        const double sinAngle = sin( angle );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data();
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;
        const uint8_t * outYEnd = outY + height * rowSizeOut;

        double inXPos = -(cosAngle * centerXOut + sinAngle * centerYOut) + centerXIn;
        double inYPos = -(-sinAngle * centerXOut + cosAngle * centerYOut) + centerYIn;

        const double minX = startXIn;
        const double minY = startYIn;
        const uint32_t maxX = startXIn + width - 1u;
        const uint32_t maxY = startYIn + height - 1u;

        for( ; outY != outYEnd; outY += rowSizeOut, inXPos += sinAngle, inYPos += cosAngle ) {
            uint8_t       * outX = outY;
            const uint8_t * outXEnd = outX + width;

            double posX = inXPos;
            double posY = inYPos;

            for( ; outX != outXEnd; ++outX, posX += cosAngle, posY -= sinAngle ) {
                if( posX < minX || posY < minY ) {
                    (*outX) = 0; // we actually do not know what is beyond an image so we set value 0
                }
                else {
                    const uint32_t x = static_cast<uint32_t>(posX);
                    const uint32_t y = static_cast<uint32_t>(posY);

                    if( x >= maxX || y >= maxY ) {
                        (*outX) = 0; // we actually do not know what is beyond an image so we set value 0
                    }
                    else {
                        const uint8_t * inX = inY + y * rowSizeIn + x;

                        // we use bilinear approximation to find pixel intensity value
                        const double coeffX = posX - x;
                        const double coeffY = posY - y;

                        // Take a weighted mean of four pixels. Use offset of 0.5
                        // so that integer conversion leads to rounding instead of 
                        // simple truncation.
                        const double sum = *(inX) * (1 - coeffX) * (1 - coeffY) + *(inX + 1) * (coeffX) * (1 - coeffY) +
                                           *(inX + rowSizeIn) * (1 - coeffX) * (coeffY) + *(inX + rowSizeIn + 1) * (coeffX) * (coeffY) + 0.5;

                        (*outX) = static_cast<uint8_t>(sum);
                    }
                }
            }
        }
    }